

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# homomorphism_model.cc
# Opt level: O1

void __thiscall
gss::innards::HomomorphismModel::HomomorphismModel
          (HomomorphismModel *this,InputGraph *target,InputGraph *pattern,HomomorphismParams *params
          ,shared_ptr<gss::innards::Proof> *proof)

{
  pair<unsigned_int,_unsigned_int> *ppVar1;
  pointer *pppVar2;
  ulong *puVar3;
  iterator iVar4;
  long lVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  uint uVar10;
  int iVar11;
  _Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false> _Var12;
  long lVar13;
  iterator iVar14;
  _Alloc_hider _Var15;
  _List_node_base *p_Var16;
  size_type sVar17;
  UnsupportedConfiguration *pUVar18;
  char *pcVar19;
  int v;
  int iVar20;
  uint uVar21;
  ulong uVar22;
  undefined8 *puVar23;
  iterator __begin3;
  ulong uVar24;
  long *******ppppppplVar25;
  long *******ppppppplVar26;
  undefined1 auVar27 [32];
  string_view sVar28;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_bool>
  pVar29;
  string_view s;
  string_view s_00;
  string_view s_01;
  int next_vertex_label;
  int next_edge_label;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> cannot_order_yet;
  list<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  pattern_less_thans_in_wrong_order;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  vertex_labels_map;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  edge_labels_map;
  int local_170;
  int local_16c;
  undefined1 local_168 [16];
  undefined1 auStack_158 [112];
  uint local_e8;
  long *******local_e0;
  long *******local_d8;
  long local_d0;
  string local_c8;
  vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
  *local_a8;
  vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
  *local_a0;
  HomomorphismParams *local_98;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  local_90;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  local_60;
  
  _Var12._M_head_impl = (Imp *)operator_new(0x2e8);
  Imp::Imp(_Var12._M_head_impl,params,proof);
  (this->_imp)._M_t.
  super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
  ._M_t.
  super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
  .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl =
       _Var12._M_head_impl;
  bVar6 = supports_exact_path_graphs(params);
  iVar20 = params->number_of_exact_path_graphs;
  bVar7 = supports_distance2_graphs(params);
  bVar8 = supports_distance3_graphs(params);
  bVar9 = supports_k4_graphs(params);
  iVar11 = 1;
  if (bVar6) {
    iVar11 = iVar20 + 1;
  }
  this->max_graphs =
       (uint)bVar9 + (uint)bVar8 + (uint)bVar7 + iVar11 +
       (int)(params->extra_shapes).
            super__List_base<std::tuple<std::unique_ptr<InputGraph,_std::default_delete<InputGraph>_>,_bool,_int>,_std::allocator<std::tuple<std::unique_ptr<InputGraph,_std::default_delete<InputGraph>_>,_bool,_int>_>_>
            ._M_impl._M_node._M_size;
  uVar10 = InputGraph::size(pattern);
  this->pattern_size = uVar10;
  uVar10 = InputGraph::size(target);
  this->target_size = uVar10;
  auVar27 = ZEXT1632(ZEXT816(0) << 0x40);
  this->pattern_less_thans_in_convenient_order =
       (vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
        )auVar27._0_24_;
  (this->target_occur_less_thans_in_convenient_order).
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)auVar27._24_8_;
  *(undefined1 (*) [32])
   &(this->pattern_less_thans_in_convenient_order).
    super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = auVar27;
  _Var12._M_head_impl =
       (this->_imp)._M_t.
       super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
       ._M_t.
       super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
       .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl;
  if (*(char *)((long)(_Var12._M_head_impl)->params + 0x88) == '\x01') {
    uVar10 = 1;
    if (*(char *)((long)(_Var12._M_head_impl)->params + 0x89) != '\0') {
      uVar10 = this->max_graphs;
    }
    (_Var12._M_head_impl)->max_graphs_for_clique_size_constraints = uVar10;
  }
  local_a0 = (vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
              *)&this->pattern_less_thans_in_convenient_order;
  local_a8 = (vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
              *)&this->target_occur_less_thans_in_convenient_order;
  local_98 = params;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::resize(&(_Var12._M_head_impl)->patterns_degrees,(ulong)this->max_graphs);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::resize(&((this->_imp)._M_t.
             super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
             ._M_t.
             super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
             .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl)->
            targets_degrees,(ulong)this->max_graphs);
  if (8 < this->max_graphs) {
    pUVar18 = (UnsupportedConfiguration *)__cxa_allocate_exception(0x28);
    local_168._0_8_ = local_168 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_168,"Supplemental graphs won\'t fit in the chosen bitset size","");
    UnsupportedConfiguration::UnsupportedConfiguration(pUVar18,(string *)local_168);
    __cxa_throw(pUVar18,&UnsupportedConfiguration::typeinfo,
                UnsupportedConfiguration::~UnsupportedConfiguration);
  }
  if (*(long *)&(((this->_imp)._M_t.
                  super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                  .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl
                 )->proof).super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2> != 0)
  {
    iVar20 = 0;
    while( true ) {
      iVar11 = InputGraph::size(pattern);
      if (iVar11 <= iVar20) break;
      _Var12._M_head_impl =
           (this->_imp)._M_t.
           super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
           ._M_t.
           super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
           .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl;
      InputGraph::vertex_name_abi_cxx11_((string *)local_168,pattern,iVar20);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &(_Var12._M_head_impl)->pattern_vertex_proof_names,(string *)local_168);
      if ((undefined1 *)local_168._0_8_ != local_168 + 0x10) {
        operator_delete((void *)local_168._0_8_,auStack_158._0_8_ + 1);
      }
      iVar20 = iVar20 + 1;
    }
    iVar20 = 0;
    while( true ) {
      iVar11 = InputGraph::size(target);
      if (iVar11 <= iVar20) break;
      _Var12._M_head_impl =
           (this->_imp)._M_t.
           super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
           ._M_t.
           super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
           .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl;
      InputGraph::vertex_name_abi_cxx11_((string *)local_168,target,iVar20);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &(_Var12._M_head_impl)->target_vertex_proof_names,(string *)local_168);
      if ((undefined1 *)local_168._0_8_ != local_168 + 0x10) {
        operator_delete((void *)local_168._0_8_,auStack_158._0_8_ + 1);
      }
      iVar20 = iVar20 + 1;
    }
  }
  bVar6 = InputGraph::directed(pattern);
  if (bVar6) {
    ((this->_imp)._M_t.
     super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
     ._M_t.
     super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
     .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl)->directed =
         true;
  }
  _Var12._M_head_impl =
       (this->_imp)._M_t.
       super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
       ._M_t.
       super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
       .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl;
  uVar10 = this->pattern_size;
  uVar21 = this->max_graphs;
  SVOBitset::SVOBitset((SVOBitset *)local_168,uVar10,0);
  std::vector<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>::resize
            (&(_Var12._M_head_impl)->pattern_graph_rows,(ulong)(uVar21 * uVar10),
             (value_type *)local_168);
  if ((0x10 < local_e8) && ((pointer)local_168._0_8_ != (pointer)0x0)) {
    operator_delete__((void *)local_168._0_8_);
  }
  std::vector<int,_std::allocator<int>_>::resize
            (&((this->_imp)._M_t.
               super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
               ._M_t.
               super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
               .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl)->
              pattern_loops,(ulong)this->pattern_size);
  if (this->pattern_size != 0) {
    uVar22 = 0;
    do {
      if (this->pattern_size != 0) {
        uVar24 = 0;
        do {
          iVar20 = (int)uVar24;
          bVar6 = InputGraph::adjacent(pattern,(int)uVar22,iVar20);
          if (bVar6) {
            _Var12._M_head_impl =
                 (this->_imp)._M_t.
                 super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                 .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl;
            if (uVar22 == uVar24) {
              *(undefined4 *)
               (*(long *)&((_Var12._M_head_impl)->pattern_loops).
                          super__Vector_base<int,_std::allocator<int>_> + uVar22 * 4) = 1;
            }
            else {
              lVar13 = *(long *)&((_Var12._M_head_impl)->pattern_graph_rows).
                                 super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
              ;
              lVar5 = (ulong)(this->max_graphs * (int)uVar22) * 0x88;
              if (*(uint *)(lVar13 + 0x80 + lVar5) < 0x11) {
                lVar13 = lVar13 + lVar5;
              }
              else {
                lVar13 = *(long *)(lVar13 + lVar5);
              }
              iVar11 = iVar20 + 0x3f;
              if (-1 < iVar20) {
                iVar11 = iVar20;
              }
              puVar3 = (ulong *)(lVar13 + (long)(iVar11 >> 6) * 8);
              *puVar3 = *puVar3 | 1L << (uVar24 & 0x3f);
            }
          }
          uVar24 = uVar24 + 1;
        } while ((uint)uVar24 < this->pattern_size);
      }
      uVar22 = uVar22 + 1;
    } while (uVar22 < this->pattern_size);
  }
  local_90._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_90._M_impl.super__Rb_tree_header._M_header;
  local_90._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_90._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_90._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_170 = 1;
  local_90._M_impl.super__Rb_tree_header._M_header._M_right =
       local_90._M_impl.super__Rb_tree_header._M_header._M_left;
  bVar6 = InputGraph::has_vertex_labels(pattern);
  if (bVar6) {
    uVar10 = this->pattern_size;
    if (uVar10 != 0) {
      uVar21 = 0;
      do {
        sVar28 = InputGraph::vertex_label(pattern,uVar21);
        local_168 = (undefined1  [16])sVar28;
        pVar29 = std::
                 _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
                 ::_M_emplace_unique<std::basic_string_view<char,std::char_traits<char>>,int&>
                           ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
                             *)&local_90,
                            (basic_string_view<char,_std::char_traits<char>_> *)local_168,&local_170
                           );
        if (((undefined1  [16])pVar29 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_170 = local_170 + 1;
        }
        uVar21 = uVar21 + 1;
        uVar10 = this->pattern_size;
      } while (uVar21 < uVar10);
    }
    std::vector<int,_std::allocator<int>_>::resize
              (&((this->_imp)._M_t.
                 super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                 .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl)
                ->pattern_vertex_labels,(ulong)uVar10);
    if (this->pattern_size != 0) {
      uVar22 = 0;
      do {
        sVar28 = InputGraph::vertex_label(pattern,(int)uVar22);
        local_168._0_8_ = local_168 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_168,sVar28._M_str,sVar28._M_str + sVar28._M_len);
        iVar14 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                 ::find(&local_90,(key_type *)local_168);
        *(_Rb_tree_color *)
         (*(long *)&(((this->_imp)._M_t.
                      super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                      .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>.
                     _M_head_impl)->pattern_vertex_labels).
                    super__Vector_base<int,_std::allocator<int>_> + uVar22 * 4) =
             iVar14._M_node[2]._M_color;
        if ((undefined1 *)local_168._0_8_ != local_168 + 0x10) {
          operator_delete((void *)local_168._0_8_,auStack_158._0_8_ + 1);
        }
        uVar22 = uVar22 + 1;
      } while (uVar22 < this->pattern_size);
    }
  }
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_16c = 1;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  bVar6 = InputGraph::has_edge_labels(pattern);
  if (bVar6) {
    std::vector<int,_std::allocator<int>_>::resize
              (&((this->_imp)._M_t.
                 super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                 .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl)
                ->pattern_edge_labels,(ulong)(this->pattern_size * this->pattern_size));
    if (this->pattern_size != 0) {
      uVar10 = 0;
      do {
        if (this->pattern_size != 0) {
          uVar21 = 0;
          do {
            bVar6 = InputGraph::adjacent(pattern,uVar10,uVar21);
            if (bVar6) {
              sVar28 = InputGraph::edge_label(pattern,uVar10,uVar21);
              local_168 = (undefined1  [16])sVar28;
              pVar29 = std::
                       _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
                       ::_M_emplace_unique<std::basic_string_view<char,std::char_traits<char>>,int&>
                                 ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
                                   *)&local_60,
                                  (basic_string_view<char,_std::char_traits<char>_> *)local_168,
                                  &local_16c);
              if (((undefined1  [16])pVar29 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                local_16c = local_16c + 1;
              }
              *(_Rb_tree_color *)
               (*(long *)&(((this->_imp)._M_t.
                            super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                            .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>.
                           _M_head_impl)->pattern_edge_labels).
                          super__Vector_base<int,_std::allocator<int>_> +
               (ulong)(this->pattern_size * uVar10 + uVar21) * 4) =
                   pVar29.first._M_node._M_node[2]._M_color;
            }
            uVar21 = uVar21 + 1;
          } while (uVar21 < this->pattern_size);
        }
        uVar10 = uVar10 + 1;
      } while (uVar10 < this->pattern_size);
    }
  }
  _Var12._M_head_impl =
       (this->_imp)._M_t.
       super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
       ._M_t.
       super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
       .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl;
  uVar10 = this->target_size;
  uVar21 = this->max_graphs;
  SVOBitset::SVOBitset((SVOBitset *)local_168,uVar10,0);
  std::vector<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>::resize
            (&(_Var12._M_head_impl)->target_graph_rows,(ulong)(uVar21 * uVar10),
             (value_type *)local_168);
  if ((0x10 < local_e8) && ((pointer)local_168._0_8_ != (pointer)0x0)) {
    operator_delete__((void *)local_168._0_8_);
  }
  std::vector<int,_std::allocator<int>_>::resize
            (&((this->_imp)._M_t.
               super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
               ._M_t.
               super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
               .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl)->
              target_loops,(ulong)this->target_size);
  local_168._8_8_ = 0;
  local_168._0_8_ = this;
  auStack_158._0_8_ =
       std::
       _Function_handler<void_(int,_int,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ciaranm[P]glasgow-subgraph-solver/gss/innards/homomorphism_model.cc:221:26)>
       ::_M_manager;
  auStack_158._8_8_ =
       std::
       _Function_handler<void_(int,_int,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ciaranm[P]glasgow-subgraph-solver/gss/innards/homomorphism_model.cc:221:26)>
       ::_M_invoke;
  InputGraph::for_each_edge
            (target,(function<void_(int,_int,_std::basic_string_view<char,_std::char_traits<char>_>)>
                     *)local_168);
  if ((code *)auStack_158._0_8_ != (code *)0x0) {
    (*(code *)auStack_158._0_8_)(local_168,local_168,3);
  }
  bVar6 = InputGraph::directed(pattern);
  if (bVar6) {
    _Var12._M_head_impl =
         (this->_imp)._M_t.
         super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
         ._M_t.
         super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
         .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl;
    uVar10 = this->target_size;
    SVOBitset::SVOBitset((SVOBitset *)local_168,uVar10,0);
    std::vector<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>::resize
              (&(_Var12._M_head_impl)->forward_target_graph_rows,(ulong)uVar10,
               (value_type *)local_168);
    if ((0x10 < local_e8) && ((pointer)local_168._0_8_ != (pointer)0x0)) {
      operator_delete__((void *)local_168._0_8_);
    }
    _Var12._M_head_impl =
         (this->_imp)._M_t.
         super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
         ._M_t.
         super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
         .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl;
    uVar10 = this->target_size;
    SVOBitset::SVOBitset((SVOBitset *)local_168,uVar10,0);
    std::vector<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>::resize
              (&(_Var12._M_head_impl)->reverse_target_graph_rows,(ulong)uVar10,
               (value_type *)local_168);
    if ((0x10 < local_e8) && ((pointer)local_168._0_8_ != (pointer)0x0)) {
      operator_delete__((void *)local_168._0_8_);
    }
    local_168._8_8_ = 0;
    local_168._0_8_ = this;
    auStack_158._0_8_ =
         std::
         _Function_handler<void_(int,_int,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ciaranm[P]glasgow-subgraph-solver/gss/innards/homomorphism_model.cc:232:30)>
         ::_M_manager;
    auStack_158._8_8_ =
         std::
         _Function_handler<void_(int,_int,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ciaranm[P]glasgow-subgraph-solver/gss/innards/homomorphism_model.cc:232:30)>
         ::_M_invoke;
    InputGraph::for_each_edge
              (target,(function<void_(int,_int,_std::basic_string_view<char,_std::char_traits<char>_>)>
                       *)local_168);
    if ((code *)auStack_158._0_8_ != (code *)0x0) {
      (*(code *)auStack_158._0_8_)(local_168,local_168,3);
    }
  }
  bVar6 = InputGraph::has_vertex_labels(pattern);
  if (bVar6) {
    uVar10 = this->target_size;
    if (uVar10 != 0) {
      uVar21 = 0;
      do {
        sVar28 = InputGraph::vertex_label(target,uVar21);
        local_168 = (undefined1  [16])sVar28;
        pVar29 = std::
                 _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
                 ::_M_emplace_unique<std::basic_string_view<char,std::char_traits<char>>,int&>
                           ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
                             *)&local_90,
                            (basic_string_view<char,_std::char_traits<char>_> *)local_168,&local_170
                           );
        if (((undefined1  [16])pVar29 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_170 = local_170 + 1;
        }
        uVar21 = uVar21 + 1;
        uVar10 = this->target_size;
      } while (uVar21 < uVar10);
    }
    std::vector<int,_std::allocator<int>_>::resize
              (&((this->_imp)._M_t.
                 super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                 .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl)
                ->target_vertex_labels,(ulong)uVar10);
    if (this->target_size != 0) {
      uVar22 = 0;
      do {
        sVar28 = InputGraph::vertex_label(target,(int)uVar22);
        local_168._0_8_ = local_168 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_168,sVar28._M_str,sVar28._M_str + sVar28._M_len);
        iVar14 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                 ::find(&local_90,(key_type *)local_168);
        *(_Rb_tree_color *)
         (*(long *)&(((this->_imp)._M_t.
                      super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                      .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>.
                     _M_head_impl)->target_vertex_labels).
                    super__Vector_base<int,_std::allocator<int>_> + uVar22 * 4) =
             iVar14._M_node[2]._M_color;
        if ((undefined1 *)local_168._0_8_ != local_168 + 0x10) {
          operator_delete((void *)local_168._0_8_,auStack_158._0_8_ + 1);
        }
        uVar22 = uVar22 + 1;
      } while (uVar22 < this->target_size);
    }
  }
  bVar6 = InputGraph::has_edge_labels(pattern);
  if (bVar6) {
    std::vector<int,_std::allocator<int>_>::resize
              (&((this->_imp)._M_t.
                 super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                 .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl)
                ->target_edge_labels,(ulong)(this->target_size * this->target_size));
    local_168 = ZEXT816(0);
    _local_168 = ZEXT1632(local_168);
    _Var15._M_p = (pointer)operator_new(0x18);
    *(_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
      **)_Var15._M_p = &local_60;
    *(int **)(_Var15._M_p + 8) = &local_16c;
    *(HomomorphismModel **)(_Var15._M_p + 0x10) = this;
    local_168._0_8_ = _Var15._M_p;
    auStack_158._0_8_ =
         std::
         _Function_handler<void_(int,_int,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ciaranm[P]glasgow-subgraph-solver/gss/innards/homomorphism_model.cc:255:30)>
         ::_M_manager;
    auStack_158._8_8_ =
         std::
         _Function_handler<void_(int,_int,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ciaranm[P]glasgow-subgraph-solver/gss/innards/homomorphism_model.cc:255:30)>
         ::_M_invoke;
    InputGraph::for_each_edge
              (target,(function<void_(int,_int,_std::basic_string_view<char,_std::char_traits<char>_>)>
                       *)local_168);
    if ((code *)auStack_158._0_8_ != (code *)0x0) {
      (*(code *)auStack_158._0_8_)(local_168,local_168,3);
    }
  }
  _Var12._M_head_impl =
       (this->_imp)._M_t.
       super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
       ._M_t.
       super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
       .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl;
  pcVar19 = (char *)(_Var12._M_head_impl)->params;
  if (*(char **)(pcVar19 + 0x90) != pcVar19 + 0x90) {
    (_Var12._M_head_impl)->has_less_thans = true;
    local_d0 = 0;
    lVar13 = (long)(_Var12._M_head_impl)->params;
    local_e0 = (long *******)&local_e0;
    local_d8 = (long *******)&local_e0;
    for (puVar23 = *(undefined8 **)(lVar13 + 0x90); puVar23 != (undefined8 *)(lVar13 + 0x90);
        puVar23 = (undefined8 *)*puVar23) {
      s._M_str = pcVar19;
      s._M_len = puVar23[2];
      iVar20 = HomomorphismModel::anon_class_1_0_00000001::operator()
                         ((anon_class_1_0_00000001 *)pattern,(InputGraph *)puVar23[3],s);
      s_00._M_str = pcVar19;
      s_00._M_len = puVar23[6];
      iVar11 = HomomorphismModel::anon_class_1_0_00000001::operator()
                         ((anon_class_1_0_00000001 *)pattern,(InputGraph *)puVar23[7],s_00);
      p_Var16 = (_List_node_base *)operator_new(0x18);
      *(int *)&p_Var16[1]._M_next = iVar20;
      *(int *)((long)&p_Var16[1]._M_next + 4) = iVar11;
      std::__detail::_List_node_base::_M_hook(p_Var16);
      local_d0 = local_d0 + 1;
    }
    if ((long ********)local_e0 != &local_e0) {
      do {
        local_168._8_4_ = 0;
        auStack_158._0_8_ = 0;
        auStack_158._16_8_ = local_168 + 8;
        auStack_158._8_8_ = auStack_158._16_8_;
        auStack_158._24_8_ = 0;
        ppppppplVar25 = local_e0;
        do {
          std::
          _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
          ::_M_emplace_unique<unsigned_int&>
                    ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                      *)local_168,(uint *)((long)ppppppplVar25 + 0x14));
          ppppppplVar25 = (long *******)*ppppppplVar25;
        } while ((long ********)ppppppplVar25 != &local_e0);
        if ((long ********)local_e0 == &local_e0) {
LAB_00121956:
          pUVar18 = (UnsupportedConfiguration *)__cxa_allocate_exception(0x28);
          local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_c8,"Pattern less than constraints form a loop","");
          UnsupportedConfiguration::UnsupportedConfiguration(pUVar18,&local_c8);
          __cxa_throw(pUVar18,&UnsupportedConfiguration::typeinfo,
                      UnsupportedConfiguration::~UnsupportedConfiguration);
        }
        bVar6 = true;
        ppppppplVar25 = local_e0;
        do {
          ppVar1 = (pair<unsigned_int,_unsigned_int> *)(ppppppplVar25 + 2);
          sVar17 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
                   count((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                          *)local_168,(key_type_conflict *)ppVar1);
          if (sVar17 == 0) {
            iVar4._M_current =
                 (this->pattern_less_thans_in_convenient_order).
                 super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            if (iVar4._M_current ==
                (this->pattern_less_thans_in_convenient_order).
                super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::
              vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
              ::_M_realloc_insert<std::pair<unsigned_int,unsigned_int>const&>(local_a0,iVar4,ppVar1)
              ;
            }
            else {
              *iVar4._M_current = *ppVar1;
              pppVar2 = &(this->pattern_less_thans_in_convenient_order).
                         super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
              *pppVar2 = *pppVar2 + 1;
            }
            ppppppplVar26 = (long *******)*ppppppplVar25;
            local_d0 = local_d0 + -1;
            std::__detail::_List_node_base::_M_unhook();
            operator_delete(ppppppplVar25,0x18);
            bVar6 = false;
          }
          else {
            ppppppplVar26 = (long *******)*ppppppplVar25;
          }
          ppppppplVar25 = ppppppplVar26;
        } while ((long ********)ppppppplVar26 != &local_e0);
        if (bVar6) goto LAB_00121956;
        std::
        _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
        ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                     *)local_168);
      } while ((long ********)local_e0 != &local_e0);
    }
  }
  _Var12._M_head_impl =
       (this->_imp)._M_t.
       super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
       ._M_t.
       super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
       .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl;
  pcVar19 = (char *)(_Var12._M_head_impl)->params;
  if (*(char **)(pcVar19 + 0xa8) != pcVar19 + 0xa8) {
    (_Var12._M_head_impl)->has_occur_less_thans = true;
    local_d0 = 0;
    lVar13 = (long)(_Var12._M_head_impl)->params;
    local_e0 = (long *******)&local_e0;
    local_d8 = (long *******)&local_e0;
    for (puVar23 = *(undefined8 **)(lVar13 + 0xa8); puVar23 != (undefined8 *)(lVar13 + 0xa8);
        puVar23 = (undefined8 *)*puVar23) {
      sVar28._M_str = pcVar19;
      sVar28._M_len = puVar23[2];
      iVar20 = HomomorphismModel::anon_class_1_0_00000001::operator()
                         ((anon_class_1_0_00000001 *)target,(InputGraph *)puVar23[3],sVar28);
      s_01._M_str = pcVar19;
      s_01._M_len = puVar23[6];
      iVar11 = HomomorphismModel::anon_class_1_0_00000001::operator()
                         ((anon_class_1_0_00000001 *)target,(InputGraph *)puVar23[7],s_01);
      p_Var16 = (_List_node_base *)operator_new(0x18);
      *(int *)&p_Var16[1]._M_next = iVar20;
      *(int *)((long)&p_Var16[1]._M_next + 4) = iVar11;
      std::__detail::_List_node_base::_M_hook(p_Var16);
      local_d0 = local_d0 + 1;
    }
    if ((long ********)local_e0 != &local_e0) {
      do {
        local_168._8_4_ = 0;
        auStack_158._0_8_ = 0;
        auStack_158._16_8_ = local_168 + 8;
        auStack_158._8_8_ = auStack_158._16_8_;
        auStack_158._24_8_ = 0;
        ppppppplVar25 = local_e0;
        do {
          std::
          _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
          ::_M_emplace_unique<unsigned_int&>
                    ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                      *)local_168,(uint *)((long)ppppppplVar25 + 0x14));
          ppppppplVar25 = (long *******)*ppppppplVar25;
        } while ((long ********)ppppppplVar25 != &local_e0);
        if ((long ********)local_e0 == &local_e0) {
LAB_001219b5:
          pUVar18 = (UnsupportedConfiguration *)__cxa_allocate_exception(0x28);
          local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_c8,"Target less than constraints form a loop","");
          UnsupportedConfiguration::UnsupportedConfiguration(pUVar18,&local_c8);
          __cxa_throw(pUVar18,&UnsupportedConfiguration::typeinfo,
                      UnsupportedConfiguration::~UnsupportedConfiguration);
        }
        bVar6 = true;
        ppppppplVar25 = local_e0;
        do {
          ppVar1 = (pair<unsigned_int,_unsigned_int> *)(ppppppplVar25 + 2);
          sVar17 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
                   count((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                          *)local_168,(key_type_conflict *)ppVar1);
          if (sVar17 == 0) {
            iVar4._M_current =
                 (this->target_occur_less_thans_in_convenient_order).
                 super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            if (iVar4._M_current ==
                (this->target_occur_less_thans_in_convenient_order).
                super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::
              vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
              ::_M_realloc_insert<std::pair<unsigned_int,unsigned_int>const&>(local_a8,iVar4,ppVar1)
              ;
            }
            else {
              *iVar4._M_current = *ppVar1;
              pppVar2 = &(this->target_occur_less_thans_in_convenient_order).
                         super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
              *pppVar2 = *pppVar2 + 1;
            }
            ppppppplVar26 = (long *******)*ppppppplVar25;
            local_d0 = local_d0 + -1;
            std::__detail::_List_node_base::_M_unhook();
            operator_delete(ppppppplVar25,0x18);
            bVar6 = false;
          }
          else {
            ppppppplVar26 = (long *******)*ppppppplVar25;
          }
          ppppppplVar25 = ppppppplVar26;
        } while ((long ********)ppppppplVar26 != &local_e0);
        if (bVar6) goto LAB_001219b5;
        std::
        _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
        ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                     *)local_168);
      } while ((long ********)local_e0 != &local_e0);
    }
  }
  if (local_98->clique_size_constraints == true) {
    _Var12._M_head_impl =
         (this->_imp)._M_t.
         super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
         ._M_t.
         super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
         .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl;
    uVar10 = (_Var12._M_head_impl)->max_graphs_for_clique_size_constraints;
    if (uVar10 != 0) {
      uVar21 = 0;
      do {
        iVar20 = InputGraph::size(pattern);
        local_c8._M_dataplus._M_p = local_c8._M_dataplus._M_p & 0xffffffff00000000;
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)local_168,(long)iVar20,
                   (value_type_conflict1 *)&local_c8,(allocator_type *)&local_e0);
        std::
        vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
        ::emplace_back<std::vector<int,std::allocator<int>>>
                  ((vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
                    *)&(_Var12._M_head_impl)->pattern_cliques_sizes,
                   (vector<int,_std::allocator<int>_> *)local_168);
        if ((pointer)local_168._0_8_ != (pointer)0x0) {
          operator_delete((void *)local_168._0_8_,auStack_158._0_8_ - local_168._0_8_);
        }
        _Var12._M_head_impl =
             (this->_imp)._M_t.
             super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
             ._M_t.
             super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
             .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl;
        iVar20 = InputGraph::size(target);
        local_c8._M_dataplus._M_p = local_c8._M_dataplus._M_p & 0xffffffff00000000;
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)local_168,(long)iVar20,
                   (value_type_conflict1 *)&local_c8,(allocator_type *)&local_e0);
        std::
        vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
        ::emplace_back<std::vector<int,std::allocator<int>>>
                  ((vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
                    *)&(_Var12._M_head_impl)->target_cliques_sizes,
                   (vector<int,_std::allocator<int>_> *)local_168);
        if ((pointer)local_168._0_8_ != (pointer)0x0) {
          operator_delete((void *)local_168._0_8_,auStack_158._0_8_ - local_168._0_8_);
        }
        _Var12._M_head_impl =
             (this->_imp)._M_t.
             super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
             ._M_t.
             super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
             .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl;
        iVar20 = InputGraph::size(pattern);
        local_c8._M_dataplus._M_p = local_c8._M_dataplus._M_p & 0xffffffff00000000;
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)local_168,(long)iVar20,
                   (value_type_conflict1 *)&local_c8,(allocator_type *)&local_e0);
        std::
        vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
        ::emplace_back<std::vector<int,std::allocator<int>>>
                  ((vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
                    *)&(_Var12._M_head_impl)->pattern_cliques_best_knowns,
                   (vector<int,_std::allocator<int>_> *)local_168);
        if ((pointer)local_168._0_8_ != (pointer)0x0) {
          operator_delete((void *)local_168._0_8_,auStack_158._0_8_ - local_168._0_8_);
        }
        _Var12._M_head_impl =
             (this->_imp)._M_t.
             super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
             ._M_t.
             super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
             .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl;
        iVar20 = InputGraph::size(target);
        local_c8._M_dataplus._M_p = local_c8._M_dataplus._M_p & 0xffffffff00000000;
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)local_168,(long)iVar20,
                   (value_type_conflict1 *)&local_c8,(allocator_type *)&local_e0);
        std::
        vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
        ::emplace_back<std::vector<int,std::allocator<int>>>
                  ((vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
                    *)&(_Var12._M_head_impl)->target_cliques_best_knowns,
                   (vector<int,_std::allocator<int>_> *)local_168);
        if ((pointer)local_168._0_8_ != (pointer)0x0) {
          operator_delete((void *)local_168._0_8_,auStack_158._0_8_ - local_168._0_8_);
        }
        uVar21 = uVar21 + 1;
        _Var12._M_head_impl =
             (this->_imp)._M_t.
             super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
             ._M_t.
             super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
             .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl;
        uVar10 = (_Var12._M_head_impl)->max_graphs_for_clique_size_constraints;
      } while (uVar21 < uVar10);
    }
    std::vector<int,_std::allocator<int>_>::resize
              (&(_Var12._M_head_impl)->largest_pattern_clique,(ulong)uVar10);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~_Rb_tree(&local_60);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~_Rb_tree(&local_90);
  return;
}

Assistant:

HomomorphismModel::HomomorphismModel(const InputGraph & target, const InputGraph & pattern, const HomomorphismParams & params,
    const std::shared_ptr<Proof> & proof) :
    _imp(new Imp(params, proof)),
    max_graphs(calculate_n_shape_graphs(params)),
    pattern_size(pattern.size()),
    target_size(target.size())
{
    if (_imp->params.clique_size_constraints)
        _imp->max_graphs_for_clique_size_constraints = (_imp->params.clique_size_constraints_on_supplementals ? max_graphs : 1);

    _imp->patterns_degrees.resize(max_graphs);
    _imp->targets_degrees.resize(max_graphs);

    if (max_graphs > 8 * sizeof(PatternAdjacencyBitsType))
        throw UnsupportedConfiguration{"Supplemental graphs won't fit in the chosen bitset size"};

    if (_imp->proof) {
        for (int v = 0; v < pattern.size(); ++v)
            _imp->pattern_vertex_proof_names.push_back(pattern.vertex_name(v));
        for (int v = 0; v < target.size(); ++v)
            _imp->target_vertex_proof_names.push_back(target.vertex_name(v));
    }

    if (pattern.directed())
        _imp->directed = true;

    // recode pattern to a bit graph, and strip out loops
    _imp->pattern_graph_rows.resize(pattern_size * max_graphs, SVOBitset(pattern_size, 0));
    _imp->pattern_loops.resize(pattern_size);
    for (unsigned i = 0; i < pattern_size; ++i) {
        for (unsigned j = 0; j < pattern_size; ++j) {
            if (pattern.adjacent(i, j)) {
                if (i == j)
                    _imp->pattern_loops[i] = 1;
                else
                    _imp->pattern_graph_rows[i * max_graphs + 0].set(j);
            }
        }
    }

    // re-encode and store pattern labels
    map<string, int> vertex_labels_map;
    int next_vertex_label = 1;
    if (pattern.has_vertex_labels()) {
        for (unsigned i = 0; i < pattern_size; ++i) {
            if (vertex_labels_map.emplace(pattern.vertex_label(i), next_vertex_label).second)
                ++next_vertex_label;
        }

        _imp->pattern_vertex_labels.resize(pattern_size);
        for (unsigned i = 0; i < pattern_size; ++i)
            _imp->pattern_vertex_labels[i] = vertex_labels_map.find(string{pattern.vertex_label(i)})->second;
    }

    // re-encode and store edge labels
    map<string, int> edge_labels_map;
    int next_edge_label = 1;
    if (pattern.has_edge_labels()) {
        _imp->pattern_edge_labels.resize(pattern_size * pattern_size);
        for (unsigned i = 0; i < pattern_size; ++i)
            for (unsigned j = 0; j < pattern_size; ++j)
                if (pattern.adjacent(i, j)) {
                    auto r = edge_labels_map.emplace(pattern.edge_label(i, j), next_edge_label);
                    if (r.second)
                        ++next_edge_label;
                    _imp->pattern_edge_labels[i * pattern_size + j] = r.first->second;
                }
    }

    // recode target to a bit graph, and take out loops
    _imp->target_graph_rows.resize(target_size * max_graphs, SVOBitset{target_size, 0});
    _imp->target_loops.resize(target_size);
    target.for_each_edge([&](int f, int t, string_view) {
        if (f == t)
            _imp->target_loops[f] = 1;
        else
            _imp->target_graph_rows[f * max_graphs + 0].set(t);
    });

    // if directed, do both directions
    if (pattern.directed()) {
        _imp->forward_target_graph_rows.resize(target_size, SVOBitset{target_size, 0});
        _imp->reverse_target_graph_rows.resize(target_size, SVOBitset{target_size, 0});
        target.for_each_edge([&](int f, int t, string_view l) {
            if (f != t && l != "unlabelled") {
                _imp->forward_target_graph_rows[f].set(t);
                _imp->reverse_target_graph_rows[t].set(f);
            }
        });
    }

    // target vertex labels
    if (pattern.has_vertex_labels()) {
        for (unsigned i = 0; i < target_size; ++i) {
            if (vertex_labels_map.emplace(target.vertex_label(i), next_vertex_label).second)
                ++next_vertex_label;
        }

        _imp->target_vertex_labels.resize(target_size);
        for (unsigned i = 0; i < target_size; ++i)
            _imp->target_vertex_labels[i] = vertex_labels_map.find(string{target.vertex_label(i)})->second;
    }

    // target edge labels
    if (pattern.has_edge_labels()) {
        _imp->target_edge_labels.resize(target_size * target_size);
        target.for_each_edge([&](int f, int t, string_view l) {
            auto r = edge_labels_map.emplace(l, next_edge_label);
            if (r.second)
                ++next_edge_label;

            _imp->target_edge_labels[f * target_size + t] = r.first->second;
        });
    }

    auto decode = [&](const InputGraph & g, string_view s) -> int {
        auto n = g.vertex_from_name(s);
        if (! n)
            throw UnsupportedConfiguration{"No vertex named '" + string{s} + "'"};
        return *n;
    };

    // pattern less than constraints
    if (! _imp->params.pattern_less_constraints.empty()) {
        _imp->has_less_thans = true;
        list<pair<unsigned, unsigned>> pattern_less_thans_in_wrong_order;
        for (auto & [a, b] : _imp->params.pattern_less_constraints) {
            auto a_decoded = decode(pattern, a), b_decoded = decode(pattern, b);
            pattern_less_thans_in_wrong_order.emplace_back(a_decoded, b_decoded);
        }

        // put them in a convenient order, so we don't need a propagation loop
        while (! pattern_less_thans_in_wrong_order.empty()) {
            bool loop_detect = true;
            set<unsigned> cannot_order_yet;
            for (auto & [_, b] : pattern_less_thans_in_wrong_order)
                cannot_order_yet.emplace(b);
            for (auto p = pattern_less_thans_in_wrong_order.begin(); p != pattern_less_thans_in_wrong_order.end();) {
                if (cannot_order_yet.count(p->first))
                    ++p;
                else {
                    loop_detect = false;
                    pattern_less_thans_in_convenient_order.push_back(*p);
                    pattern_less_thans_in_wrong_order.erase(p++);
                }
            }

            if (loop_detect)
                throw UnsupportedConfiguration{"Pattern less than constraints form a loop"};
        }
    }

    // target less than constraints
    if (! _imp->params.target_occur_less_constraints.empty()) {
        _imp->has_occur_less_thans = true;
        list<pair<unsigned, unsigned>> target_occur_less_thans_in_wrong_order;
        for (auto & [a, b] : _imp->params.target_occur_less_constraints) {
            auto a_decoded = decode(target, a), b_decoded = decode(target, b);
            target_occur_less_thans_in_wrong_order.emplace_back(a_decoded, b_decoded);
        }

        // put them in a convenient order, so we don't need a propagation loop
        while (! target_occur_less_thans_in_wrong_order.empty()) {
            bool loop_detect = true;
            set<unsigned> cannot_order_yet;
            for (auto & [_, b] : target_occur_less_thans_in_wrong_order)
                cannot_order_yet.emplace(b);
            for (auto t = target_occur_less_thans_in_wrong_order.begin(); t != target_occur_less_thans_in_wrong_order.end();) {
                if (cannot_order_yet.count(t->first))
                    ++t;
                else {
                    loop_detect = false;
                    target_occur_less_thans_in_convenient_order.push_back(*t);
                    target_occur_less_thans_in_wrong_order.erase(t++);
                }
            }

            if (loop_detect)
                throw UnsupportedConfiguration{"Target less than constraints form a loop"};
        }
    }

    // make space for clique constraints
    if (params.clique_size_constraints) {
        for (unsigned g = 0; g < _imp->max_graphs_for_clique_size_constraints; ++g) {
            _imp->pattern_cliques_sizes.push_back(vector<int>(pattern.size(), 0));
            _imp->target_cliques_sizes.push_back(vector<int>(target.size(), 0));
            _imp->pattern_cliques_best_knowns.push_back(vector<int>(pattern.size(), 0));
            _imp->target_cliques_best_knowns.push_back(vector<int>(target.size(), 0));
        }
        _imp->largest_pattern_clique.resize(_imp->max_graphs_for_clique_size_constraints);
    }
}